

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

Stream * __thiscall kratos::Stream::operator<<(Stream *this,AssignStmt *stmt)

{
  allocator<kratos::IRNode_*> *this_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  char cVar1;
  bool bVar2;
  int iVar3;
  AssignmentType AVar4;
  Var **ppVVar5;
  ulong uVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  StmtException *pSVar8;
  optional<kratos::EventControl> *poVar9;
  EventControl *pEVar10;
  SystemVerilogCodeGenOptions *pSVar11;
  reference pvVar12;
  size_type sVar13;
  basic_ostream<char,_std::char_traits<char>_> *pbVar14;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view sVar15;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  ulong local_380;
  uint64_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  right_wrapped;
  anon_class_16_2_0738fce5 output_delay;
  anon_class_8_1_8991fb9c var_str_func;
  Var *local_340;
  Var *local_338;
  AssignStmt *local_330;
  Var **local_328;
  size_type local_320;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_318;
  string local_300;
  string_view local_2e0;
  undefined1 local_2ca;
  allocator<kratos::IRNode_*> local_2c9;
  AssignStmt *local_2c8;
  AssignStmt **local_2c0;
  size_type local_2b8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_2b0;
  allocator<char> local_291;
  string local_290;
  undefined1 local_26a;
  allocator<kratos::IRNode_*> local_269;
  Var *local_268;
  Var *local_260;
  AssignStmt *local_258;
  Var **local_250;
  size_type local_248;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_240;
  string local_228;
  string local_208 [8];
  string eq;
  string prefix;
  string local_1b8;
  undefined1 local_188 [8];
  string right;
  string left;
  AssignStmt *stmt_local;
  Stream *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_130;
  basic_string_view<char> local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char (*local_e0) [55];
  char *local_d8;
  string *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_70) [55];
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  ppVVar5 = AssignStmt::left(stmt);
  var_str_abi_cxx11_((string *)((long)&right.field_2 + 8),this,*ppVVar5);
  ppVVar5 = AssignStmt::right(stmt);
  var_str_abi_cxx11_((string *)local_188,this,*ppVVar5);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar7 = std::operator<<((ostream *)&(this->super_stringstream).field_0x10,"// ");
    strip_newline(&local_1b8,&(stmt->super_Stmt).super_IRNode.comment);
    poVar7 = std::operator<<(poVar7,(string *)&local_1b8);
    cVar1 = endl(this);
    std::operator<<(poVar7,cVar1);
    std::__cxx11::string::~string((string *)&local_1b8);
    sVar15 = SystemVerilogCodeGen::indent
                       (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                    &(this->super_stringstream).field_0x10,sVar15);
  }
  if ((*(byte *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) & 1) != 0) {
    (stmt->super_Stmt).super_IRNode.verilog_ln =
         (uint32_t)*(undefined8 *)&(this->super_stringstream).field_0x90;
  }
  std::__cxx11::string::string((string *)(eq.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_208);
  iVar3 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[4])();
  if (CONCAT44(extraout_var,iVar3) == *(long *)&(this->super_stringstream).field_0x80) {
    AVar4 = AssignStmt::assign_type(stmt);
    if (AVar4 != Blocking) {
      local_26a = 1;
      pSVar8 = (StmtException *)__cxa_allocate_exception(0x10);
      local_60 = &local_228;
      local_68 = "Top level assignment for {0} <- {1} has to be blocking";
      local_70 = (char (*) [55])((long)&right.field_2 + 8);
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_188;
      fmt::v7::
      make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[55],char>
                (&local_a8,(v7 *)"Top level assignment for {0} <- {1} has to be blocking",local_70,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
      local_80 = &local_a8;
      local_b8 = fmt::v7::to_string_view<char,_0>(local_68);
      local_50 = &local_c8;
      local_58 = local_80;
      local_28 = local_80;
      local_18 = local_80;
      local_20 = local_50;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_50,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_80);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_c8.field_1.values_;
      format_str.size_ = local_c8.desc_;
      format_str.data_ = (char *)local_b8.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_228,(detail *)local_b8.data_,format_str,args);
      ppVVar5 = AssignStmt::left(stmt);
      local_268 = *ppVVar5;
      ppVVar5 = AssignStmt::right(stmt);
      local_260 = *ppVVar5;
      local_250 = &local_268;
      local_248 = 3;
      local_258 = stmt;
      std::allocator<kratos::IRNode_*>::allocator(&local_269);
      __l_01._M_len = local_248;
      __l_01._M_array = (iterator)local_250;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                (&local_240,__l_01,&local_269);
      StmtException::StmtException(pSVar8,&local_228,&local_240);
      local_26a = 0;
      __cxa_throw(pSVar8,&StmtException::typeinfo,StmtException::~StmtException);
    }
    bVar2 = AssignStmt::has_delay(stmt);
    if (bVar2) {
      local_2ca = 1;
      pSVar8 = (StmtException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"Continuous assignment cannot have delay",&local_291);
      local_2c0 = &local_2c8;
      local_2b8 = 1;
      local_2c8 = stmt;
      std::allocator<kratos::IRNode_*>::allocator(&local_2c9);
      __l_00._M_len = local_2b8;
      __l_00._M_array = (iterator)local_2c0;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                (&local_2b0,__l_00,&local_2c9);
      StmtException::StmtException(pSVar8,&local_290,&local_2b0);
      local_2ca = 0;
      __cxa_throw(pSVar8,&StmtException::typeinfo,StmtException::~StmtException);
    }
    std::__cxx11::string::operator=((string *)(eq.field_2._M_local_buf + 8),"assign ");
    std::__cxx11::string::operator=(local_208,"=");
  }
  else {
    local_2e0 = SystemVerilogCodeGen::indent
                          (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    std::__cxx11::string::operator=((string *)(eq.field_2._M_local_buf + 8),&local_2e0);
    AVar4 = AssignStmt::assign_type(stmt);
    if (AVar4 == Blocking) {
      std::__cxx11::string::operator=(local_208,"=");
    }
    else {
      AVar4 = AssignStmt::assign_type(stmt);
      if (AVar4 != NonBlocking) {
        var_str_func.this._6_1_ = 1;
        pSVar8 = (StmtException *)__cxa_allocate_exception(0x10);
        local_d0 = &local_300;
        local_d8 = "Top level assignment for {0} <- {1} has to be blocking";
        local_e0 = (char (*) [55])((long)&right.field_2 + 8);
        vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_188;
        fmt::v7::
        make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[55],char>
                  (&local_118,(v7 *)"Top level assignment for {0} <- {1} has to be blocking",
                   local_e0,(remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs_1,
                   in_R8);
        local_f0 = &local_118;
        local_128 = fmt::v7::to_string_view<char,_0>(local_d8);
        local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&this_local;
        local_48 = local_f0;
        local_38 = local_f0;
        local_10 = local_f0;
        local_30 = local_40;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_40,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_f0);
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_130.values_;
        format_str_00.size_ = (size_t)this_local;
        format_str_00.data_ = (char *)local_128.size_;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_300,(detail *)local_128.data_,format_str_00,args_00);
        ppVVar5 = AssignStmt::left(stmt);
        local_340 = *ppVVar5;
        ppVVar5 = AssignStmt::right(stmt);
        local_338 = *ppVVar5;
        local_328 = &local_340;
        local_320 = 3;
        this_00 = (allocator<kratos::IRNode_*> *)((long)&var_str_func.this + 7);
        local_330 = stmt;
        std::allocator<kratos::IRNode_*>::allocator(this_00);
        __l._M_len = local_320;
        __l._M_array = (iterator)local_328;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_318,__l,this_00);
        StmtException::StmtException(pSVar8,&local_300,&local_318);
        var_str_func.this._6_1_ = 0;
        __cxa_throw(pSVar8,&StmtException::typeinfo,StmtException::~StmtException);
      }
      std::__cxx11::string::operator=(local_208,"<=");
    }
  }
  std::operator<<((ostream *)&(this->super_stringstream).field_0x10,
                  (string *)(eq.field_2._M_local_buf + 8));
  output_delay.this = (Stream *)&output_delay.var_str_func;
  right_wrapped.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  output_delay.var_str_func = (anon_class_8_1_8991fb9c *)this;
  bVar2 = AssignStmt::has_delay(stmt);
  if (bVar2) {
    poVar9 = AssignStmt::get_delay(stmt);
    pEVar10 = std::optional<kratos::EventControl>::operator->(poVar9);
    if (pEVar10->delay_side == left) {
      poVar9 = AssignStmt::get_delay(stmt);
      pEVar10 = std::optional<kratos::EventControl>::operator*(poVar9);
      operator<<::anon_class_16_2_0738fce5::operator()
                ((anon_class_16_2_0738fce5 *)
                 &right_wrapped.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar10);
    }
  }
  poVar7 = std::operator<<((ostream *)&(this->super_stringstream).field_0x10,
                           (string *)(right.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7," ");
  poVar7 = std::operator<<(poVar7,local_208);
  std::operator<<(poVar7," ");
  bVar2 = AssignStmt::has_delay(stmt);
  if (bVar2) {
    poVar9 = AssignStmt::get_delay(stmt);
    pEVar10 = std::optional<kratos::EventControl>::operator->(poVar9);
    if (pEVar10->delay_side == right) {
      poVar9 = AssignStmt::get_delay(stmt);
      pEVar10 = std::optional<kratos::EventControl>::operator*(poVar9);
      operator<<::anon_class_16_2_0738fce5::operator()
                ((anon_class_16_2_0738fce5 *)
                 &right_wrapped.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar10);
    }
  }
  pSVar11 = SystemVerilogCodeGen::options
                      (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
  line_wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i,(string *)local_188,(uint32_t)pSVar11->line_wrap);
  pvVar12 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,0);
  std::operator<<((ostream *)&(this->super_stringstream).field_0x10,(string *)pvVar12);
  local_380 = 1;
  while( true ) {
    sVar13 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i);
    if (sVar13 <= local_380) break;
    cVar1 = endl(this);
    std::operator<<((ostream *)&(this->super_stringstream).field_0x10,cVar1);
    sVar15 = SystemVerilogCodeGen::indent
                       (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    pbVar14 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                              &(this->super_stringstream).field_0x10,sVar15);
    poVar7 = std::operator<<(pbVar14,"    ");
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i,local_380);
    std::operator<<(poVar7,(string *)pvVar12);
    local_380 = local_380 + 1;
  }
  poVar7 = std::operator<<((ostream *)&(this->super_stringstream).field_0x10,";");
  cVar1 = endl(this);
  std::operator<<(poVar7,cVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)(eq.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)(right.field_2._M_local_buf + 8));
  return this;
}

Assistant:

Stream& Stream::operator<<(AssignStmt* stmt) {
    const auto left = var_str(stmt->left());
    const auto right = var_str(stmt->right());
    if (!stmt->comment.empty()) {
        (*this) << "// " << strip_newline(stmt->comment) << endl();
        (*this) << codegen_->indent();
    }

    if (generator_->debug) {
        stmt->verilog_ln = line_no_;
    }

    std::string prefix;
    std::string eq;

    if (stmt->parent() == generator_) {
        // top level
        if (stmt->assign_type() != AssignmentType::Blocking)
            throw StmtException(
                ::format("Top level assignment for {0} <- {1} has to be blocking", left, right),
                {stmt->left(), stmt->right(), stmt});
        if (stmt->has_delay()) {
            throw StmtException("Continuous assignment cannot have delay", {stmt});
        }
        prefix = "assign ";
        eq = "=";
    } else {
        prefix = codegen_->indent();
        if (stmt->assign_type() == AssignmentType::Blocking)
            eq = "=";
        else if (stmt->assign_type() == AssignmentType::NonBlocking)
            eq = "<=";
        else
            throw StmtException(
                ::format("Top level assignment for {0} <- {1} has to be blocking", left, right),
                {stmt->left(), stmt->right(), stmt});
    }

    (*this) << prefix;
    auto var_str_func = [this](const Var* v) { return var_str(v); };
    auto output_delay = [this, &var_str_func](const EventControl& e) {
        switch (e.type) {
            case EventControlType::Delay: {
                (*this) << e.to_string(var_str_func) << ' ';
                break;
            }
            case EventControlType::Edge: {
                (*this) << "@(" << e.to_string(var_str_func) << ") ";
            }
        }
    };
    // lhs delay
    if (stmt->has_delay() && stmt->get_delay()->delay_side == EventControl::DelaySide::left) {
        // this is a lhs delay
        output_delay(*stmt->get_delay());
    }

    (*this) << left << " " << eq << " ";  //<< right << ";" << endl();

    // rhs delay
    if (stmt->has_delay() && stmt->get_delay()->delay_side == EventControl::DelaySide::right) {
        // this is a rhs delay
        output_delay(*stmt->get_delay());
    }

    auto right_wrapped = line_wrap(right, codegen_->options().line_wrap);
    (*this) << right_wrapped[0];
    for (uint64_t i = 1; i < right_wrapped.size(); i++) {
        // compute new indent
        (*this) << endl();
        (*this) << codegen_->indent() << "    " << right_wrapped[i];
    }
    (*this) << ";" << endl();
    return *this;
}